

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O0

int ncnn::deconvolution(Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
                       int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,
                       int activation_type,Mat *activation_params,Option *opt)

{
  int iVar1;
  float *pfVar2;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  undefined4 *puVar3;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  long *in_stack_00000030;
  int i_3;
  int size_1;
  float *outptr_1;
  float w_1;
  int k;
  float val;
  int q;
  float *kptr;
  float *outptr;
  int j_1;
  int i_2;
  int outh;
  int outw_1;
  int inch;
  int h;
  int w;
  float bias;
  Mat out;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outw;
  Mat *m;
  int i_1;
  float *ptr;
  int size;
  Mat *m_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  float local_484;
  allocator_type *in_stack_fffffffffffffb80;
  size_type in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  undefined4 local_428;
  int local_3e8;
  int local_3d4;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined4 local_3b8;
  long local_3b0;
  undefined4 local_3a8;
  undefined4 local_3a4;
  undefined4 local_3a0;
  undefined4 local_39c;
  undefined4 local_398;
  undefined8 local_390;
  float local_388;
  int local_384;
  long local_380;
  long local_378;
  int local_370;
  int local_36c;
  int local_368;
  int local_364;
  int local_360;
  int local_35c;
  int local_358;
  undefined4 local_354;
  undefined4 *local_350;
  int *local_348;
  ulong local_340;
  undefined4 local_338;
  long *local_330;
  int local_328;
  int local_324;
  int local_320;
  undefined4 local_31c;
  int local_318;
  ulong local_310;
  int local_308;
  int local_304;
  int local_300;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  reference local_2f0;
  vector<int,_std::allocator<int>_> local_2d0;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  long *local_2a0;
  long *local_298;
  long *local_290;
  long *local_288;
  undefined8 *local_280;
  undefined4 **local_270;
  long *local_260;
  int local_248;
  undefined4 local_244;
  undefined4 **local_240;
  undefined8 *local_220;
  undefined4 *local_208;
  long *local_1f8;
  undefined1 local_1ed;
  int local_1ec;
  undefined4 **local_1e0;
  long local_1b8;
  long *local_1b0;
  int local_1a4;
  undefined4 *local_1a0;
  int local_198;
  undefined4 local_194;
  undefined4 **local_190;
  undefined4 **local_188;
  int local_17c;
  undefined4 **local_178;
  long *local_170;
  undefined1 local_165;
  int local_164;
  undefined8 *local_158;
  int local_12c;
  undefined8 *local_128;
  undefined4 **local_120;
  float local_114;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  long *local_f0;
  float local_e4 [3];
  long *local_d8;
  undefined8 local_d0;
  long *local_c8;
  undefined8 local_c0;
  long *local_b8;
  undefined8 local_b0;
  long *local_a8;
  undefined8 local_a0;
  long *local_98;
  long local_90;
  undefined4 local_84;
  long local_80;
  long local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  long *local_58;
  undefined4 local_4c;
  ulong local_48;
  undefined4 *local_40;
  int local_34;
  int local_30;
  int local_2c;
  undefined4 **local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  undefined8 extraout_XMM0_Qb;
  
  local_2ac = *(int *)((long)in_RSI + 0x2c);
  local_2b0 = (int)in_RSI[7];
  local_2b4 = in_R8D * in_R9D;
  local_2a8 = in_R9D;
  local_2a4 = in_R8D;
  local_2a0 = in_RCX;
  local_298 = in_RDX;
  local_290 = in_RSI;
  local_288 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0xa4dbcb);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),in_stack_fffffffffffffb88
             ,in_stack_fffffffffffffb80);
  std::allocator<int>::~allocator((allocator<int> *)0xa4dbf7);
  local_2f0 = std::vector<int,_std::allocator<int>_>::operator[](&local_2d0,0);
  local_2f4 = 0;
  local_2f8 = 0;
  local_2fc = local_2ac * in_stack_00000020 - local_2a4 * in_stack_00000018;
  for (local_300 = 0; local_300 < local_2a8; local_300 = local_300 + 1) {
    for (local_304 = 0; local_304 < local_2a4; local_304 = local_304 + 1) {
      local_2f0[local_2f4] = local_2f8;
      local_2f4 = local_2f4 + 1;
      local_2f8 = in_stack_00000018 + local_2f8;
    }
    local_2f8 = local_2fc + local_2f8;
  }
  for (local_308 = 0; local_308 < local_2b0; local_308 = local_308 + 1) {
    local_1e0 = &local_350;
    local_2c = *(int *)((long)local_290 + 0x2c);
    local_30 = (int)local_290[6];
    local_34 = *(int *)((long)local_290 + 0x34);
    puVar3 = (undefined4 *)(*local_290 + local_290[8] * (long)local_308 * local_290[2]);
    local_48 = local_290[2];
    local_4c = (undefined4)local_290[3];
    local_58 = (long *)local_290[4];
    local_28 = &local_350;
    local_348 = (int *)0x0;
    local_31c = 1;
    local_18 = (long)local_2c * (long)local_30 * local_48;
    local_310 = (local_18 + 0xfU & 0xfffffffffffffff0) / local_48;
    local_328 = (int)local_290[5] + -1;
    if ((int)local_290[5] == 4) {
      local_310 = (long)*(int *)((long)local_290 + 0x2c) * (long)(int)local_290[6];
    }
    local_1c = 0x10;
    local_1ec = local_308;
    local_1ed = 1;
    local_260 = local_2a0;
    bVar4 = true;
    if (*local_2a0 != 0) {
      local_1f8 = local_2a0;
      bVar4 = local_2a0[8] * (long)(int)local_2a0[7] == 0;
    }
    if (bVar4) {
      local_428 = 0;
    }
    else {
      local_1b8 = (long)local_308;
      local_1b0 = local_2a0;
      local_428 = *(undefined4 *)(*local_2a0 + local_1b8 * 4);
    }
    local_354 = local_428;
    local_190 = &local_350;
    local_194 = local_428;
    local_198 = (int)local_310 * local_34;
    local_1a0 = puVar3;
    for (local_1a4 = 0; local_1a4 < local_198; local_1a4 = local_1a4 + 1) {
      *local_1a0 = local_428;
      local_1a0 = local_1a0 + 1;
    }
    local_358 = *(int *)((long)local_288 + 0x2c);
    local_35c = (int)local_288[6];
    local_360 = (int)local_288[7];
    local_364 = *(int *)((long)local_290 + 0x2c);
    local_368 = (int)local_290[6];
    for (local_36c = 0; local_36c < local_35c; local_36c = local_36c + 1) {
      for (local_370 = 0; local_370 < local_358; local_370 = local_370 + 1) {
        local_17c = local_36c * in_stack_00000010;
        local_178 = &local_350;
        local_378 = (long)puVar3 +
                    (long)(local_370 * in_stack_00000008) * 4 +
                    (long)local_2c * (long)local_17c * local_48;
        local_170 = local_298;
        local_380 = *local_298 + (long)(local_2b4 * local_360 * local_308) * 4;
        for (local_384 = 0; local_384 < local_360; local_384 = local_384 + 1) {
          local_158 = &local_3d0;
          local_64 = *(int *)((long)local_288 + 0x2c);
          local_68 = (int)local_288[6];
          local_6c = *(undefined4 *)((long)local_288 + 0x34);
          local_78 = *local_288 + local_288[8] * (long)local_384 * local_288[2];
          local_80 = local_288[2];
          local_84 = (undefined4)local_288[3];
          local_90 = local_288[4];
          local_60 = &local_3d0;
          local_8 = (long)local_64 * (long)local_68 * local_80;
          local_c = 0x10;
          local_164 = local_384;
          local_165 = 1;
          local_128 = &local_3d0;
          local_12c = local_36c;
          local_388 = *(float *)(local_78 + (long)local_64 * (long)local_36c * local_80 +
                                (long)local_370 * 4);
          local_280 = &local_3d0;
          local_3d0 = 0;
          local_3c0 = 0;
          local_3b8 = 0;
          local_3a8 = 0;
          local_3a4 = 0;
          local_3a0 = 0;
          local_39c = 0;
          local_398 = 0;
          local_390 = 0;
          local_3c8 = 0;
          for (local_3d4 = 0; local_3d4 < local_2b4; local_3d4 = local_3d4 + 1) {
            *(float *)(local_378 + (long)local_2f0[local_3d4] * 4) =
                 local_388 * *(float *)(local_380 + (long)local_3d4 * 4) +
                 *(float *)(local_378 + (long)local_2f0[local_3d4] * 4);
          }
          local_380 = local_380 + (long)local_2b4 * 4;
          local_220 = local_280;
          local_3b0 = local_90;
        }
      }
    }
    local_120 = &local_350;
    iVar1 = local_364 * local_368;
    local_188 = local_190;
    local_40 = puVar3;
    local_350 = puVar3;
    local_340 = local_48;
    local_338 = local_4c;
    local_330 = local_58;
    local_324 = local_2c;
    local_320 = local_30;
    local_318 = local_34;
    for (local_3e8 = 0; local_3e8 < iVar1; local_3e8 = local_3e8 + 1) {
      local_484 = (float)puVar3[local_3e8];
      local_f0 = in_stack_00000030;
      in_stack_fffffffffffffb80 = (allocator_type *)(ulong)(in_stack_00000028 - 1);
      local_e4[0] = local_484;
      switch(in_stack_fffffffffffffb80) {
      case (allocator_type *)0x0:
        dVar5 = std::fmax((double)(ulong)(uint)local_484,0.0);
        local_e4[0] = SUB84(dVar5,0);
        break;
      case (allocator_type *)0x1:
        local_98 = in_stack_00000030;
        local_a0 = 0;
        local_f4 = *(float *)*in_stack_00000030;
        if (local_484 <= 0.0) {
          local_484 = local_484 * local_f4;
        }
        local_e4[0] = local_484;
        break;
      case (allocator_type *)0x2:
        local_a8 = in_stack_00000030;
        local_b0 = 0;
        local_f8 = *(float *)*in_stack_00000030;
        local_b8 = in_stack_00000030;
        local_c0 = 1;
        local_fc = *(float *)(*in_stack_00000030 + 4);
        if (local_484 < local_f8) {
          local_e4[0] = local_f8;
        }
        if (local_fc < local_e4[0]) {
          local_e4[0] = local_fc;
        }
        break;
      case (allocator_type *)0x3:
        local_100 = 88.37626;
        pfVar2 = std::min<float>(local_e4,&local_100);
        local_e4[0] = *pfVar2;
        local_104 = -88.37626;
        pfVar2 = std::max<float>(local_e4,&local_104);
        local_e4[0] = *pfVar2;
        dVar5 = std::exp((double)(ulong)(uint)-local_e4[0]);
        local_e4[0] = 1.0 / (SUB84(dVar5,0) + 1.0);
        break;
      case (allocator_type *)0x4:
        auVar6._0_8_ = std::exp((double)(ulong)(uint)local_484);
        auVar6._8_8_ = extraout_XMM0_Qb;
        auVar7._4_12_ = auVar6._4_12_;
        auVar7._0_4_ = SUB84(auVar6._0_8_,0) + 1.0;
        dVar5 = std::log(auVar7._0_8_);
        dVar5 = std::tanh(dVar5);
        local_e4[0] = local_484 * SUB84(dVar5,0);
        break;
      case (allocator_type *)0x5:
        local_c8 = in_stack_00000030;
        local_d0 = 0;
        local_108 = *(float *)*in_stack_00000030;
        local_d8 = in_stack_00000030;
        local_e4[1] = 1.4013e-45;
        local_e4[2] = 0.0;
        local_10c = *(float *)(*in_stack_00000030 + 4);
        local_110 = -local_10c / local_108;
        local_114 = 1.0 / local_108 + local_110;
        if (local_110 <= local_484) {
          if (local_484 <= local_114) {
            local_e4[0] = local_484 * (local_484 * local_108 + local_10c);
          }
        }
        else {
          local_e4[0] = 0.0;
        }
      }
      puVar3[local_3e8] = local_e4[0];
    }
    local_270 = &local_350;
    local_240 = local_270;
    if (local_348 != (int *)0x0) {
      local_244 = 0xffffffff;
      LOCK();
      local_248 = *local_348;
      *local_348 = *local_348 + -1;
      UNLOCK();
      if (local_248 == 1) {
        if (local_330 == (long *)0x0) {
          local_208 = local_350;
          if (local_350 != (undefined4 *)0x0) {
            free(local_350);
          }
        }
        else {
          (**(code **)(*local_330 + 0x18))(local_330,local_350);
        }
      }
    }
    local_350 = (undefined4 *)0x0;
    local_340 = 0;
    local_338 = 0;
    local_328 = 0;
    local_324 = 0;
    local_320 = 0;
    local_31c = 0;
    local_318 = 0;
    local_310 = 0;
    local_348 = (int *)0x0;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb80);
  return 0;
}

Assistant:

static int deconvolution(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int outw = top_blob.w;
    const int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias = bias_data.empty() ? 0.f : bias_data[p];

        out.fill(bias);

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int inch = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < h; i++)
        {
            for (int j = 0; j < w; j++)
            {
                float* outptr = out.row(i * stride_h) + j * stride_w;

                const float* kptr = (const float*)weight_data + maxk * inch * p;

                for (int q = 0; q < inch; q++)
                {
                    const float val = bottom_blob.channel(q).row(i)[j];

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[space_ofs[k]] += val * w;
                    }

                    kptr += maxk;
                }
            }
        }

        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
            }
        }
    }

    return 0;
}